

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O0

vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_> * __thiscall
pstd::vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>::operator=
          (vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_> *this,
          vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_> *other)

{
  bool bVar1;
  polymorphic_allocator<pbrt::ShapeHandle> *ppVar2;
  size_t sVar3;
  vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_> *in_RSI;
  vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_> *in_RDI;
  size_t i;
  polymorphic_allocator<pbrt::ShapeHandle> *in_stack_ffffffffffffffc8;
  ShapeHandle *p;
  vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>
  *in_stack_ffffffffffffffd0;
  polymorphic_allocator<pbrt::ShapeHandle> *this_00;
  polymorphic_allocator<pbrt::ShapeHandle> *local_20;
  vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_> *this_01;
  
  if (in_RDI != in_RSI) {
    this_01 = in_RDI;
    bVar1 = pmr::operator==(&in_stack_ffffffffffffffd0->alloc,in_stack_ffffffffffffffc8);
    if (bVar1) {
      swap<pbrt::ShapeHandle*>(&in_RDI->ptr,&in_RSI->ptr);
      swap<unsigned_long>(&in_RDI->nAlloc,&in_RSI->nAlloc);
      swap<unsigned_long>(&in_RDI->nStored,&in_RSI->nStored);
    }
    else {
      clear(in_stack_ffffffffffffffd0);
      size(in_RSI);
      reserve(this_01,(size_t)in_RSI);
      local_20 = (polymorphic_allocator<pbrt::ShapeHandle> *)0x0;
      while (this_00 = local_20, ppVar2 = (polymorphic_allocator<pbrt::ShapeHandle> *)size(in_RSI),
            this_00 < ppVar2) {
        p = in_RDI->ptr + (long)local_20;
        operator[](in_RSI,(size_type)local_20);
        pmr::polymorphic_allocator<pbrt::ShapeHandle>::
        construct<pbrt::ShapeHandle,pbrt::ShapeHandle>(this_00,p,(ShapeHandle *)0x47a811);
        local_20 = (polymorphic_allocator<pbrt::ShapeHandle> *)((long)&local_20->memoryResource + 1)
        ;
      }
      sVar3 = size(in_RSI);
      in_RDI->nStored = sVar3;
    }
  }
  return in_RDI;
}

Assistant:

vector &operator=(vector &&other) {
        if (this == &other)
            return *this;

        if (alloc == other.alloc) {
            pstd::swap(ptr, other.ptr);
            pstd::swap(nAlloc, other.nAlloc);
            pstd::swap(nStored, other.nStored);
        } else {
            clear();
            reserve(other.size());
            for (size_t i = 0; i < other.size(); ++i)
                alloc.template construct<T>(ptr + i, std::move(other[i]));
            nStored = other.size();
        }

        return *this;
    }